

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O0

int SPAKE2_generate_msg(SPAKE2_CTX *ctx,uint8_t *out,size_t *out_len,size_t max_out_len,
                       uint8_t *password,size_t password_len)

{
  crypto_word_t cVar1;
  uint8_t *local_430;
  undefined1 local_420 [8];
  ge_p2 Pstar_proj;
  ge_p1p1 Pstar;
  ge_cached mask_cached;
  ge_p3 mask;
  scalar tmp;
  scalar order;
  scalar password_scalar;
  uint8_t password_tmp [64];
  ge_p3 P;
  uint8_t private_tmp [64];
  size_t password_len_local;
  uint8_t *password_local;
  size_t max_out_len_local;
  size_t *out_len_local;
  uint8_t *out_local;
  SPAKE2_CTX *ctx_local;
  
  if (ctx->state == spake2_state_init) {
    if (max_out_len < 0x20) {
      ctx_local._4_4_ = 0;
    }
    else {
      RAND_bytes((uchar *)(P.T.v + 4),0x40);
      x25519_sc_reduce((uint8_t *)(P.T.v + 4));
      left_shift_3((uint8_t *)(P.T.v + 4));
      OPENSSL_memcpy(ctx,P.T.v + 4,0x20);
      x25519_ge_scalarmult_base((ge_p3 *)(password_tmp + 0x38),ctx->private_key);
      SHA512(password,password_len,(uchar *)(password_scalar.words + 3));
      OPENSSL_memcpy(ctx->password_hash,password_scalar.words + 3,0x40);
      x25519_sc_reduce((uint8_t *)(password_scalar.words + 3));
      OPENSSL_memcpy(order.words + 3,password_scalar.words + 3,0x20);
      if (ctx->disable_password_scalar_hack == '\0') {
        tmp.words[3] = 0x5812631a5cf5d3ed;
        order.words[0] = 0x14def9dea2f79cd6;
        order.words[1] = 0;
        order.words[2] = 0x1000000000000000;
        OPENSSL_memset(mask.T.v + 4,0,0x20);
        cVar1 = constant_time_eq_w(order.words[3] & 1,1);
        scalar_cmov((scalar *)(mask.T.v + 4),(scalar *)(tmp.words + 3),cVar1);
        scalar_add((scalar *)(order.words + 3),(scalar *)(mask.T.v + 4));
        scalar_double((scalar *)(tmp.words + 3));
        OPENSSL_memset(mask.T.v + 4,0,0x20);
        cVar1 = constant_time_eq_w(order.words[3] & 2,2);
        scalar_cmov((scalar *)(mask.T.v + 4),(scalar *)(tmp.words + 3),cVar1);
        scalar_add((scalar *)(order.words + 3),(scalar *)(mask.T.v + 4));
        scalar_double((scalar *)(tmp.words + 3));
        OPENSSL_memset(mask.T.v + 4,0,0x20);
        cVar1 = constant_time_eq_w(order.words[3] & 4,4);
        scalar_cmov((scalar *)(mask.T.v + 4),(scalar *)(tmp.words + 3),cVar1);
        scalar_add((scalar *)(order.words + 3),(scalar *)(mask.T.v + 4));
        if ((order.words[3] & 7) != 0) {
          __assert_fail("(password_scalar.words[0] & 7) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/spake25519.cc"
                        ,0x1a5,
                        "int SPAKE2_generate_msg(SPAKE2_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t)"
                       );
        }
      }
      OPENSSL_memcpy(ctx->password_scalar,order.words + 3,0x20);
      if (ctx->my_role == spake2_role_alice) {
        local_430 = kSpakeMSmallPrecomp;
      }
      else {
        local_430 = kSpakeNSmallPrecomp;
      }
      x25519_ge_scalarmult_small_precomp
                ((ge_p3 *)(mask_cached.T2d.v + 4),ctx->password_scalar,local_430);
      x25519_ge_p3_to_cached((ge_cached *)(Pstar.T.v + 4),(ge_p3 *)(mask_cached.T2d.v + 4));
      x25519_ge_add((ge_p1p1 *)(Pstar_proj.Z.v + 4),(ge_p3 *)(password_tmp + 0x38),
                    (ge_cached *)(Pstar.T.v + 4));
      x25519_ge_p1p1_to_p2((ge_p2 *)local_420,(ge_p1p1 *)(Pstar_proj.Z.v + 4));
      x25519_ge_tobytes(ctx->my_msg,(ge_p2 *)local_420);
      OPENSSL_memcpy(out,ctx->my_msg,0x20);
      *out_len = 0x20;
      ctx->state = spake2_state_msg_generated;
      ctx_local._4_4_ = 1;
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int SPAKE2_generate_msg(SPAKE2_CTX *ctx, uint8_t *out, size_t *out_len,
                        size_t max_out_len, const uint8_t *password,
                        size_t password_len) {
  if (ctx->state != spake2_state_init) {
    return 0;
  }

  if (max_out_len < sizeof(ctx->my_msg)) {
    return 0;
  }

  uint8_t private_tmp[64];
  RAND_bytes(private_tmp, sizeof(private_tmp));
  x25519_sc_reduce(private_tmp);
  // Multiply by the cofactor (eight) so that we'll clear it when operating on
  // the peer's point later in the protocol.
  left_shift_3(private_tmp);
  OPENSSL_memcpy(ctx->private_key, private_tmp, sizeof(ctx->private_key));

  ge_p3 P;
  x25519_ge_scalarmult_base(&P, ctx->private_key);

  // mask = h(password) * <N or M>.
  uint8_t password_tmp[SHA512_DIGEST_LENGTH];
  SHA512(password, password_len, password_tmp);
  OPENSSL_memcpy(ctx->password_hash, password_tmp, sizeof(ctx->password_hash));
  x25519_sc_reduce(password_tmp);

  // Due to a copy-paste error, the call to |left_shift_3| was omitted after
  // the |x25519_sc_reduce|, just above. This meant that |ctx->password_scalar|
  // was not a multiple of eight to clear the cofactor and thus three bits of
  // the password hash would leak. In order to fix this in a unilateral way,
  // points of small order are added to the mask point such that it is in the
  // prime-order subgroup. Since the ephemeral scalar is a multiple of eight,
  // these points will cancel out when calculating the shared secret.
  //
  // Adding points of small order is the same as adding multiples of the prime
  // order to the password scalar. Since that's faster, that is what is done
  // below. The prime order (kOrder) is a large prime, thus odd, thus the LSB
  // is one. So adding it will flip the LSB. Adding twice it will flip the next
  // bit and so one for all the bottom three bits.

  scalar password_scalar;
  OPENSSL_memcpy(&password_scalar, password_tmp, sizeof(password_scalar));

  // |password_scalar| is the result of |x25519_sc_reduce| and thus is, at
  // most, $l-1$ (where $l$ is |kOrder|, the order of the prime-order subgroup
  // of Ed25519). In the following, we may add $l + 2×l + 4×l$ for a max value
  // of $8×l-1$. That is < 2**256, as required.

  if (!ctx->disable_password_scalar_hack) {
    scalar order = kOrder;
    scalar tmp;

    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 1, 1));
    scalar_add(&password_scalar, &tmp);

    scalar_double(&order);
    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 2, 2));
    scalar_add(&password_scalar, &tmp);

    scalar_double(&order);
    OPENSSL_memset(&tmp, 0, sizeof(tmp));
    scalar_cmov(&tmp, &order,
                constant_time_eq_w(password_scalar.words[0] & 4, 4));
    scalar_add(&password_scalar, &tmp);

    assert((password_scalar.words[0] & 7) == 0);
  }

  OPENSSL_memcpy(ctx->password_scalar, password_scalar.words,
                 sizeof(ctx->password_scalar));

  ge_p3 mask;
  x25519_ge_scalarmult_small_precomp(&mask, ctx->password_scalar,
                                     ctx->my_role == spake2_role_alice
                                         ? kSpakeMSmallPrecomp
                                         : kSpakeNSmallPrecomp);

  // P* = P + mask.
  ge_cached mask_cached;
  x25519_ge_p3_to_cached(&mask_cached, &mask);
  ge_p1p1 Pstar;
  x25519_ge_add(&Pstar, &P, &mask_cached);

  // Encode P*
  ge_p2 Pstar_proj;
  x25519_ge_p1p1_to_p2(&Pstar_proj, &Pstar);
  x25519_ge_tobytes(ctx->my_msg, &Pstar_proj);

  OPENSSL_memcpy(out, ctx->my_msg, sizeof(ctx->my_msg));
  *out_len = sizeof(ctx->my_msg);
  ctx->state = spake2_state_msg_generated;

  return 1;
}